

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress4X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int flags)

{
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  HUF_DTable HVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  ulong *puVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  byte bVar18;
  undefined2 *puVar19;
  ulong *puVar20;
  ulong *puVar21;
  int iVar22;
  byte *srcBuffer;
  int iVar23;
  int iVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  undefined4 in_register_0000008c;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong *puVar33;
  bool bVar34;
  BYTE *pStart;
  uint local_154;
  uint local_150;
  ulong local_148;
  ulong *local_140;
  undefined2 *local_138;
  ulong local_130;
  uint local_124;
  undefined2 *local_120;
  BIT_DStream_t local_110;
  ulong local_e8;
  ulong *local_e0;
  ulong *local_d8;
  undefined2 *local_d0;
  undefined2 *local_c8;
  undefined2 *local_c0;
  undefined2 *local_b8;
  size_t local_a8;
  ulong *local_a0;
  undefined2 *local_98;
  int local_80;
  int local_7c;
  size_t local_70;
  
  if ((flags & 1U) != 0) {
    if (((flags & 0x20U) == 0) &&
       (sVar17 = HUF_decompress4X2_usingDTable_internal_fast
                           (dst,dstSize,cSrc,cSrcSize,DTable,
                            (HUF_DecompressFastLoopFn)CONCAT44(in_register_0000008c,flags)),
       sVar17 != 0)) {
      return sVar17;
    }
    sVar17 = HUF_decompress4X2_usingDTable_internal_bmi2(dst,dstSize,cSrc,cSrcSize,DTable);
    return sVar17;
  }
  if (cSrcSize < 10) {
    return 0xffffffffffffffec;
  }
  uVar6 = *cSrc;
  uVar29 = (ulong)uVar6;
  uVar7 = *(ushort *)((long)cSrc + 2);
  uVar8 = *(ushort *)((long)cSrc + 4);
  uVar16 = uVar29 + uVar7 + (ulong)uVar8 + 6;
  if (dstSize < 6) {
    return 0xffffffffffffffec;
  }
  if (cSrcSize < uVar16) {
    return 0xffffffffffffffec;
  }
  local_98 = (undefined2 *)(dstSize + (long)dst);
  uVar25 = dstSize + 3 >> 2;
  local_c8 = (undefined2 *)(uVar25 + (long)dst);
  local_c0 = (undefined2 *)((long)local_c8 + uVar25);
  local_d0 = (undefined2 *)(uVar25 + (long)local_c0);
  if (local_98 < local_d0) {
    return 0xffffffffffffffec;
  }
  if (uVar6 == 0) {
    return 0xffffffffffffffb8;
  }
  local_d8 = (ulong *)((long)cSrc + 6);
  puVar28 = (ulong *)((long)cSrc + uVar29 + 6);
  HVar9 = *DTable;
  if (uVar6 < 8) {
    local_130 = (ulong)*(byte *)local_d8;
    switch(uVar6) {
    case 2:
      goto LAB_0018f9e6;
    case 3:
      goto LAB_0018f9dc;
    case 4:
      goto LAB_0018f9ca;
    case 5:
      goto LAB_0018f9bc;
    case 6:
      break;
    case 7:
      local_130 = local_130 | (ulong)*(byte *)((long)cSrc + 0xc) << 0x30;
      break;
    default:
      goto switchD_0018f96f_default;
    }
    local_130 = local_130 + ((ulong)*(byte *)((long)cSrc + 0xb) << 0x28);
LAB_0018f9bc:
    local_130 = local_130 + ((ulong)*(byte *)((long)cSrc + 10) << 0x20);
LAB_0018f9ca:
    local_130 = local_130 + (ulong)*(byte *)((long)cSrc + 9) * 0x1000000;
LAB_0018f9dc:
    local_130 = local_130 + (ulong)*(byte *)((long)cSrc + 8) * 0x10000;
LAB_0018f9e6:
    local_130 = local_130 + (ulong)*(byte *)((long)cSrc + 7) * 0x100;
    local_a8 = dstSize;
switchD_0018f96f_default:
    bVar2 = *(byte *)((long)cSrc + uVar29 + 5);
    if (bVar2 == 0) {
      return 0xffffffffffffffec;
    }
    uVar15 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    local_150 = (uVar15 ^ 0x1f) + (uint)uVar6 * -8 + 0x29;
    local_140 = local_d8;
  }
  else {
    bVar2 = *(byte *)((long)cSrc + uVar29 + 5);
    if (bVar2 == 0) {
      return 0xffffffffffffffff;
    }
    local_130 = *(ulong *)((long)cSrc + (uVar29 - 2));
    uVar15 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    local_150 = ~uVar15 + 9;
    local_140 = (ulong *)((long)cSrc + (uVar29 - 2));
  }
  if (uVar7 == 0) {
    return 0xffffffffffffffb8;
  }
  puVar26 = (ulong *)((ulong)uVar7 + (long)puVar28);
  if (uVar7 < 8) {
    local_e8 = (ulong)(byte)*puVar28;
    switch(uVar7) {
    case 2:
      goto LAB_0018fb09;
    case 3:
      goto LAB_0018fafe;
    case 4:
      goto LAB_0018faf3;
    case 5:
      goto LAB_0018fae7;
    case 6:
      break;
    case 7:
      local_e8 = local_e8 | (ulong)*(byte *)((long)cSrc + uVar29 + 0xc) << 0x30;
      break;
    default:
      goto switchD_0018fa96_default;
    }
    local_e8 = local_e8 + ((ulong)*(byte *)((long)cSrc + uVar29 + 0xb) << 0x28);
LAB_0018fae7:
    local_e8 = local_e8 + ((ulong)*(byte *)((long)cSrc + uVar29 + 10) << 0x20);
LAB_0018faf3:
    local_e8 = local_e8 + (ulong)*(byte *)((long)cSrc + uVar29 + 9) * 0x1000000;
LAB_0018fafe:
    local_e8 = local_e8 + (ulong)*(byte *)((long)cSrc + uVar29 + 8) * 0x10000;
LAB_0018fb09:
    local_e8 = local_e8 + (ulong)*(byte *)((long)cSrc + uVar29 + 7) * 0x100;
switchD_0018fa96_default:
    bVar2 = *(byte *)((long)puVar26 + -1);
    if (bVar2 == 0) {
      return 0xffffffffffffffec;
    }
    uVar15 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    local_154 = (uVar15 ^ 0x1f) + (uint)uVar7 * -8 + 0x29;
    local_e0 = puVar28;
  }
  else {
    bVar2 = *(byte *)((long)puVar26 + -1);
    if (bVar2 == 0) {
      return 0xffffffffffffffff;
    }
    local_e8 = puVar26[-1];
    uVar15 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    local_154 = ~uVar15 + 9;
    local_e0 = puVar26 + -1;
  }
  if (uVar8 == 0) {
    return 0xffffffffffffffb8;
  }
  srcBuffer = (byte *)((ulong)uVar8 + (long)puVar26);
  if (uVar8 < 8) {
    local_148 = (ulong)(byte)*puVar26;
    switch(uVar8) {
    case 2:
      goto LAB_0018fc26;
    case 3:
      goto LAB_0018fc1c;
    case 4:
      goto LAB_0018fc12;
    case 5:
      goto LAB_0018fc07;
    case 6:
      break;
    case 7:
      local_148 = local_148 | (ulong)*(byte *)((long)puVar26 + 6) << 0x30;
      break;
    default:
      goto switchD_0018fbc7_default;
    }
    local_148 = local_148 + ((ulong)*(byte *)((long)puVar26 + 5) << 0x28);
LAB_0018fc07:
    local_148 = local_148 + ((ulong)*(byte *)((long)puVar26 + 4) << 0x20);
LAB_0018fc12:
    local_148 = local_148 + (ulong)*(byte *)((long)puVar26 + 3) * 0x1000000;
LAB_0018fc1c:
    local_148 = local_148 + (ulong)*(byte *)((long)puVar26 + 2) * 0x10000;
LAB_0018fc26:
    local_148 = local_148 + (ulong)*(byte *)((long)puVar26 + 1) * 0x100;
switchD_0018fbc7_default:
    bVar2 = srcBuffer[-1];
    if (bVar2 == 0) {
      return 0xffffffffffffffec;
    }
    uVar15 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    local_124 = (uVar15 ^ 0x1f) + (uint)uVar8 * -8 + 0x29;
    local_a0 = puVar26;
  }
  else {
    bVar2 = srcBuffer[-1];
    if (bVar2 == 0) {
      return 0xffffffffffffffff;
    }
    local_148 = *(ulong *)(srcBuffer + -8);
    uVar15 = 0x1f;
    if (bVar2 != 0) {
      for (; bVar2 >> uVar15 == 0; uVar15 = uVar15 - 1) {
      }
    }
    local_124 = ~uVar15 + 9;
    local_a0 = (ulong *)(srcBuffer + -8);
  }
  sVar17 = BIT_initDStream(&local_110,srcBuffer,cSrcSize - uVar16);
  if (0xffffffffffffff88 < sVar17) {
    return sVar17;
  }
  puVar19 = (undefined2 *)((long)dst + (dstSize - 7));
  puVar20 = (ulong *)((long)cSrc + 0xe);
  puVar21 = (ulong *)((long)cSrc + uVar29 + 0xe);
  puVar1 = puVar26 + 1;
  bVar2 = (byte)(HVar9 >> 0x10);
  if (local_d0 < puVar19 && 7 < (ulong)((long)local_98 - (long)local_d0)) {
    local_70 = local_110.bitContainer;
    bVar18 = -bVar2 & 0x3f;
    local_b8 = local_c8;
    local_138 = local_c0;
    local_120 = local_d0;
    do {
      uVar16 = (local_130 << ((byte)local_150 & 0x3f)) >> bVar18;
      *(short *)dst = (short)DTable[uVar16 + 1];
      iVar22 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_150;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar29 = (local_130 << ((byte)iVar22 & 0x3f)) >> bVar18;
      *(short *)((long)dst + uVar16) = (short)DTable[uVar29 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar22;
      uVar25 = (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7);
      uVar30 = (local_130 << ((byte)iVar22 & 0x3f)) >> bVar18;
      *(short *)((long)dst + uVar25 + uVar16) = (short)DTable[uVar30 + 1];
      iVar22 = (uint)*(byte *)((long)DTable + uVar30 * 4 + 6) + iVar22;
      uVar29 = (local_130 << ((byte)iVar22 & 0x3f)) >> bVar18;
      lVar10 = uVar25 + uVar16;
      uVar30 = (ulong)*(byte *)((long)DTable + uVar30 * 4 + 7);
      *(short *)((long)dst + uVar30 + lVar10) = (short)DTable[uVar29 + 1];
      bVar3 = *(byte *)((long)DTable + uVar29 * 4 + 6);
      bVar4 = *(byte *)((long)DTable + uVar29 * 4 + 7);
      uVar16 = (local_e8 << ((byte)local_154 & 0x3f)) >> bVar18;
      *local_b8 = (short)DTable[uVar16 + 1];
      iVar23 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_154;
      uVar29 = (local_e8 << ((byte)iVar23 & 0x3f)) >> bVar18;
      local_150 = (uint)bVar3 + iVar22;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      *(short *)((long)local_b8 + uVar16) = (short)DTable[uVar29 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
      uVar25 = (local_e8 << ((byte)iVar23 & 0x3f)) >> bVar18;
      uVar29 = (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7);
      *(short *)((long)local_b8 + uVar29 + uVar16) = (short)DTable[uVar25 + 1];
      lVar11 = uVar29 + uVar16;
      iVar23 = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
      uVar29 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
      uVar16 = (local_e8 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)local_b8 + uVar29 + lVar11) = (short)DTable[uVar16 + 1];
      iVar22 = 3;
      if (local_140 < puVar20) {
        local_7c = 3;
      }
      else {
        local_140 = (ulong *)((long)local_140 - (ulong)(local_150 >> 3));
        local_150 = local_150 & 7;
        local_130 = *local_140;
        local_7c = 0;
      }
      local_154 = iVar23 + (uint)*(byte *)((long)DTable + uVar16 * 4 + 6);
      bVar3 = *(byte *)((long)DTable + uVar16 * 4 + 7);
      if (puVar21 <= local_e0) {
        local_e0 = (ulong *)((long)local_e0 - (ulong)(local_154 >> 3));
        local_154 = local_154 & 7;
        local_e8 = *local_e0;
        iVar22 = 0;
      }
      uVar16 = (local_148 << ((byte)local_124 & 0x3f)) >> bVar18;
      *local_138 = (short)DTable[uVar16 + 1];
      iVar23 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_124;
      uVar25 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar16 = (local_148 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)local_138 + uVar25) = (short)DTable[uVar16 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar23;
      uVar32 = (local_148 << ((byte)iVar23 & 0x3f)) >> bVar18;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      lVar12 = uVar16 + uVar25;
      *(short *)((long)local_138 + uVar16 + uVar25) = (short)DTable[uVar32 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar32 * 4 + 6) + iVar23;
      uVar27 = (ulong)*(byte *)((long)DTable + uVar32 * 4 + 7);
      uVar16 = (local_148 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)local_138 + uVar27 + lVar12) = (short)DTable[uVar16 + 1];
      uVar25 = (local_70 << ((byte)local_110.bitsConsumed & 0x3f)) >> bVar18;
      local_124 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar23;
      bVar5 = *(byte *)((long)DTable + uVar16 * 4 + 7);
      *local_120 = (short)DTable[uVar25 + 1];
      iVar23 = *(byte *)((long)DTable + uVar25 * 4 + 6) + local_110.bitsConsumed;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
      uVar25 = (local_70 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)local_120 + uVar16) = (short)DTable[uVar25 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
      uVar25 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
      uVar31 = (local_70 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)local_120 + uVar25 + uVar16) = (short)DTable[uVar31 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar31 * 4 + 6) + iVar23;
      uVar32 = (local_70 << ((byte)iVar23 & 0x3f)) >> bVar18;
      lVar13 = uVar25 + uVar16;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar31 * 4 + 7);
      *(short *)((long)local_120 + uVar16 + lVar13) = (short)DTable[uVar32 + 1];
      iVar24 = 3;
      if (local_a0 < puVar1) {
        local_80 = 3;
      }
      else {
        local_a0 = (ulong *)((long)local_a0 - (ulong)(local_124 >> 3));
        local_124 = local_124 & 7;
        local_148 = *local_a0;
        local_80 = 0;
      }
      local_110.bitsConsumed = iVar23 + (uint)*(byte *)((long)DTable + uVar32 * 4 + 6);
      if (local_110.limitPtr <= local_110.ptr) {
        local_110.ptr = (char *)((long)local_110.ptr - (ulong)(local_110.bitsConsumed >> 3));
        local_110.bitsConsumed = local_110.bitsConsumed & 7;
        local_110.bitContainer = *(size_t *)local_110.ptr;
        iVar24 = 0;
        local_70 = local_110.bitContainer;
      }
      dst = (void *)((long)dst + (ulong)bVar4 + uVar30 + lVar10);
      local_b8 = (undefined2 *)((long)local_b8 + (ulong)bVar3 + uVar29 + lVar11);
      local_138 = (undefined2 *)((long)local_138 + (ulong)bVar5 + uVar27 + lVar12);
      local_120 = (undefined2 *)
                  ((long)local_120 +
                  (ulong)*(byte *)((long)DTable + uVar32 * 4 + 7) + uVar16 + lVar13);
    } while ((local_120 < puVar19) &&
            (((iVar22 == 0 && local_7c == 0) && local_80 == 0) && iVar24 == 0));
  }
  else {
    local_120 = local_d0;
    local_138 = local_c0;
    local_b8 = local_c8;
  }
  if ((local_c8 < dst) || (local_c0 < local_b8)) {
    return 0xffffffffffffffec;
  }
  if (local_d0 < local_138) {
    return 0xffffffffffffffec;
  }
  iVar22 = (int)local_d8;
  puVar33 = local_140;
  if ((ulong)((long)local_c8 - (long)dst) < 8) {
    if (local_150 < 0x41) {
      if (local_140 < puVar20) {
        puVar33 = local_d8;
        if (local_140 == local_d8) goto LAB_00190677;
        uVar15 = (int)local_140 - iVar22;
        if (local_d8 <= (ulong *)((long)local_140 - (ulong)(local_150 >> 3))) {
          uVar15 = local_150 >> 3;
        }
        local_150 = local_150 + uVar15 * -8;
      }
      else {
        uVar15 = local_150 >> 3;
        local_150 = local_150 & 7;
      }
      local_130 = *(ulong *)((long)local_140 - (ulong)uVar15);
      puVar33 = (ulong *)((long)local_140 - (ulong)uVar15);
    }
  }
  else if (bVar2 < 0xc) {
    if (local_150 < 0x41) {
      bVar18 = -bVar2 & 0x3f;
      do {
        if (local_140 < puVar20) {
          puVar33 = local_d8;
          if (local_140 == local_d8) break;
          bVar34 = local_d8 <= (ulong *)((long)local_140 - (ulong)(local_150 >> 3));
          uVar15 = (int)local_140 - iVar22;
          if (bVar34) {
            uVar15 = local_150 >> 3;
          }
          local_150 = local_150 + uVar15 * -8;
        }
        else {
          uVar15 = local_150 >> 3;
          local_150 = local_150 & 7;
          bVar34 = true;
        }
        puVar33 = (ulong *)((long)local_140 - (ulong)uVar15);
        local_130 = *puVar33;
        if (((undefined2 *)((long)local_c8 - 9U) <= dst) || (!bVar34)) break;
        uVar16 = (local_130 << ((byte)local_150 & 0x3f)) >> bVar18;
        *(short *)dst = (short)DTable[uVar16 + 1];
        iVar23 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_150;
        uVar29 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar16 = (local_130 << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)dst + uVar29) = (short)DTable[uVar16 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar23;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar10 = uVar16 + uVar29;
        uVar25 = (local_130 << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)dst + uVar16 + uVar29) = (short)DTable[uVar25 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
        uVar29 = (local_130 << ((byte)iVar23 & 0x3f)) >> bVar18;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
        lVar11 = uVar16 + lVar10;
        *(short *)((long)dst + uVar16 + lVar10) = (short)DTable[uVar29 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7);
        uVar29 = (local_130 << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)dst + uVar16 + lVar11) = (short)DTable[uVar29 + 1];
        local_150 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7) + uVar16 + lVar11
                      );
        local_140 = puVar33;
        if (0x40 < local_150) break;
      } while( true );
    }
  }
  else if (local_150 < 0x41) {
    bVar18 = -bVar2 & 0x3f;
    do {
      if (local_140 < puVar20) {
        puVar33 = local_d8;
        if (local_140 == local_d8) break;
        bVar34 = local_d8 <= (ulong *)((long)local_140 - (ulong)(local_150 >> 3));
        uVar15 = (int)local_140 - iVar22;
        if (bVar34) {
          uVar15 = local_150 >> 3;
        }
        local_150 = local_150 + uVar15 * -8;
      }
      else {
        uVar15 = local_150 >> 3;
        local_150 = local_150 & 7;
        bVar34 = true;
      }
      local_140 = (ulong *)((long)local_140 - (ulong)uVar15);
      local_130 = *local_140;
      puVar33 = local_140;
      if (((undefined2 *)((long)local_c8 - 7U) <= dst) || (!bVar34)) break;
      uVar16 = (local_130 << ((byte)local_150 & 0x3f)) >> bVar18;
      *(short *)dst = (short)DTable[uVar16 + 1];
      iVar23 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_150;
      uVar29 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar16 = (local_130 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)dst + uVar29) = (short)DTable[uVar16 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar23;
      uVar25 = (local_130 << ((byte)iVar23 & 0x3f)) >> bVar18;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      lVar10 = uVar16 + uVar29;
      *(short *)((long)dst + uVar16 + uVar29) = (short)DTable[uVar25 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
      uVar29 = (local_130 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)dst + uVar16 + lVar10) = (short)DTable[uVar29 + 1];
      local_150 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7) + uVar16 + lVar10);
      if (0x40 < local_150) break;
    } while( true );
  }
LAB_00190677:
  if (1 < (ulong)((long)local_c8 - (long)dst)) {
    puVar14 = puVar33;
    if (local_150 < 0x41) {
      do {
        if (puVar33 < puVar20) {
          puVar14 = local_d8;
          if (puVar33 == local_d8) break;
          bVar34 = local_d8 <= (ulong *)((long)puVar33 - (ulong)(local_150 >> 3));
          uVar15 = (int)puVar33 - iVar22;
          if (bVar34) {
            uVar15 = local_150 >> 3;
          }
          local_150 = local_150 + uVar15 * -8;
        }
        else {
          uVar15 = local_150 >> 3;
          local_150 = local_150 & 7;
          bVar34 = true;
        }
        puVar33 = (ulong *)((long)puVar33 - (ulong)uVar15);
        local_130 = *puVar33;
        puVar14 = puVar33;
        if ((local_c8 + -1 < dst) || (!bVar34)) break;
        uVar16 = (local_130 << ((byte)local_150 & 0x3f)) >> (-bVar2 & 0x3f);
        *(short *)dst = (short)DTable[uVar16 + 1];
        local_150 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_150;
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7));
        if (0x40 < local_150) break;
      } while( true );
    }
    for (; puVar33 = puVar14, dst <= local_c8 + -1;
        dst = (void *)((ulong)*(byte *)((long)DTable + uVar16 * 4 + 7) + (long)dst)) {
      uVar16 = (local_130 << ((byte)local_150 & 0x3f)) >> (-bVar2 & 0x3f);
      *(short *)dst = (short)DTable[uVar16 + 1];
      local_150 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_150;
      puVar14 = puVar33;
    }
  }
  if (dst < local_c8) {
    uVar16 = (local_130 << ((byte)local_150 & 0x3f)) >> (-bVar2 & 0x3f);
    *(char *)dst = (char)DTable[uVar16 + 1];
    if (*(char *)((long)DTable + uVar16 * 4 + 7) == '\x01') {
      local_150 = local_150 + *(byte *)((long)DTable + uVar16 * 4 + 6);
    }
    else if ((local_150 < 0x40) &&
            (local_150 = local_150 + *(byte *)((long)DTable + uVar16 * 4 + 6), 0x3f < local_150)) {
      local_150 = 0x40;
    }
  }
  iVar22 = (int)puVar28;
  puVar20 = local_e0;
  if ((ulong)((long)local_c0 - (long)local_b8) < 8) {
    if (local_154 < 0x41) {
      if (local_e0 < puVar21) {
        puVar20 = puVar28;
        if (local_e0 == puVar28) goto LAB_00190bc3;
        uVar15 = (int)local_e0 - iVar22;
        if (puVar28 <= (ulong *)((long)local_e0 - (ulong)(local_154 >> 3))) {
          uVar15 = local_154 >> 3;
        }
        local_154 = local_154 + uVar15 * -8;
      }
      else {
        uVar15 = local_154 >> 3;
        local_154 = local_154 & 7;
      }
      local_e8 = *(ulong *)((long)local_e0 - (ulong)uVar15);
      puVar20 = (ulong *)((long)local_e0 - (ulong)uVar15);
    }
  }
  else if (bVar2 < 0xc) {
    if (local_154 < 0x41) {
      bVar18 = -bVar2 & 0x3f;
      do {
        if (local_e0 < puVar21) {
          puVar20 = puVar28;
          if (local_e0 == puVar28) break;
          bVar34 = puVar28 <= (ulong *)((long)local_e0 - (ulong)(local_154 >> 3));
          uVar15 = (int)local_e0 - iVar22;
          if (bVar34) {
            uVar15 = local_154 >> 3;
          }
          local_154 = local_154 + uVar15 * -8;
        }
        else {
          uVar15 = local_154 >> 3;
          local_154 = local_154 & 7;
          bVar34 = true;
        }
        puVar20 = (ulong *)((long)local_e0 - (ulong)uVar15);
        local_e8 = *puVar20;
        if (((undefined2 *)((long)local_c0 - 9U) <= local_b8) || (!bVar34)) break;
        uVar16 = (local_e8 << ((byte)local_154 & 0x3f)) >> bVar18;
        *local_b8 = (short)DTable[uVar16 + 1];
        iVar23 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_154;
        uVar29 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar16 = (local_e8 << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)local_b8 + uVar29) = (short)DTable[uVar16 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar23;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar10 = uVar16 + uVar29;
        uVar25 = (local_e8 << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)local_b8 + uVar16 + uVar29) = (short)DTable[uVar25 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
        uVar29 = (local_e8 << ((byte)iVar23 & 0x3f)) >> bVar18;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
        lVar11 = uVar16 + lVar10;
        *(short *)((long)local_b8 + uVar16 + lVar10) = (short)DTable[uVar29 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7);
        uVar29 = (local_e8 << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)local_b8 + uVar16 + lVar11) = (short)DTable[uVar29 + 1];
        local_154 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
        local_b8 = (undefined2 *)
                   ((long)local_b8 +
                   (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7) + uVar16 + lVar11);
        local_e0 = puVar20;
        if (0x40 < local_154) break;
      } while( true );
    }
  }
  else if (local_154 < 0x41) {
    bVar18 = -bVar2 & 0x3f;
    do {
      if (local_e0 < puVar21) {
        puVar20 = puVar28;
        if (local_e0 == puVar28) break;
        bVar34 = puVar28 <= (ulong *)((long)local_e0 - (ulong)(local_154 >> 3));
        uVar15 = (int)local_e0 - iVar22;
        if (bVar34) {
          uVar15 = local_154 >> 3;
        }
        local_154 = local_154 + uVar15 * -8;
      }
      else {
        uVar15 = local_154 >> 3;
        local_154 = local_154 & 7;
        bVar34 = true;
      }
      local_e0 = (ulong *)((long)local_e0 - (ulong)uVar15);
      local_e8 = *local_e0;
      puVar20 = local_e0;
      if (((undefined2 *)((long)local_c0 - 7U) <= local_b8) || (!bVar34)) break;
      uVar16 = (local_e8 << ((byte)local_154 & 0x3f)) >> bVar18;
      *local_b8 = (short)DTable[uVar16 + 1];
      iVar23 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_154;
      uVar29 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar16 = (local_e8 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)local_b8 + uVar29) = (short)DTable[uVar16 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar23;
      uVar25 = (local_e8 << ((byte)iVar23 & 0x3f)) >> bVar18;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      lVar10 = uVar16 + uVar29;
      *(short *)((long)local_b8 + uVar16 + uVar29) = (short)DTable[uVar25 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
      uVar29 = (local_e8 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)local_b8 + uVar16 + lVar10) = (short)DTable[uVar29 + 1];
      local_154 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
      local_b8 = (undefined2 *)
                 ((long)local_b8 + (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7) + uVar16 + lVar10
                 );
      if (0x40 < local_154) break;
    } while( true );
  }
LAB_00190bc3:
  if (1 < (ulong)((long)local_c0 - (long)local_b8)) {
    puVar14 = puVar20;
    if (local_154 < 0x41) {
      do {
        if (puVar20 < puVar21) {
          puVar14 = puVar28;
          if (puVar20 == puVar28) break;
          bVar34 = puVar28 <= (ulong *)((long)puVar20 - (ulong)(local_154 >> 3));
          uVar15 = (int)puVar20 - iVar22;
          if (bVar34) {
            uVar15 = local_154 >> 3;
          }
          local_154 = local_154 + uVar15 * -8;
        }
        else {
          uVar15 = local_154 >> 3;
          local_154 = local_154 & 7;
          bVar34 = true;
        }
        puVar20 = (ulong *)((long)puVar20 - (ulong)uVar15);
        local_e8 = *puVar20;
        puVar14 = puVar20;
        if ((local_c0 + -1 < local_b8) || (!bVar34)) break;
        uVar16 = (local_e8 << ((byte)local_154 & 0x3f)) >> (-bVar2 & 0x3f);
        *local_b8 = (short)DTable[uVar16 + 1];
        local_154 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_154;
        local_b8 = (undefined2 *)((long)local_b8 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7));
        if (0x40 < local_154) break;
      } while( true );
    }
    for (; puVar20 = puVar14, local_b8 <= local_c0 + -1;
        local_b8 = (undefined2 *)((ulong)*(byte *)((long)DTable + uVar16 * 4 + 7) + (long)local_b8))
    {
      uVar16 = (local_e8 << ((byte)local_154 & 0x3f)) >> (-bVar2 & 0x3f);
      *local_b8 = (short)DTable[uVar16 + 1];
      local_154 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_154;
      puVar14 = puVar20;
    }
  }
  if (local_b8 < local_c0) {
    uVar16 = (local_e8 << ((byte)local_154 & 0x3f)) >> (-bVar2 & 0x3f);
    *(char *)local_b8 = (char)DTable[uVar16 + 1];
    if (*(char *)((long)DTable + uVar16 * 4 + 7) == '\x01') {
      local_154 = local_154 + *(byte *)((long)DTable + uVar16 * 4 + 6);
    }
    else if ((local_154 < 0x40) &&
            (local_154 = local_154 + *(byte *)((long)DTable + uVar16 * 4 + 6), 0x3f < local_154)) {
      local_154 = 0x40;
    }
  }
  iVar22 = (int)puVar26;
  puVar21 = local_a0;
  if ((ulong)((long)local_d0 - (long)local_138) < 8) {
    if (local_124 < 0x41) {
      if (local_a0 < puVar1) {
        puVar21 = puVar26;
        if (local_a0 == puVar26) goto LAB_001910af;
        uVar15 = (int)local_a0 - iVar22;
        if (puVar26 <= (ulong *)((long)local_a0 - (ulong)(local_124 >> 3))) {
          uVar15 = local_124 >> 3;
        }
        local_124 = local_124 + uVar15 * -8;
      }
      else {
        uVar15 = local_124 >> 3;
        local_124 = local_124 & 7;
      }
      local_148 = *(ulong *)((long)local_a0 - (ulong)uVar15);
      puVar21 = (ulong *)((long)local_a0 - (ulong)uVar15);
    }
  }
  else if (bVar2 < 0xc) {
    if (local_124 < 0x41) {
      bVar18 = -bVar2 & 0x3f;
      do {
        if (local_a0 < puVar1) {
          puVar21 = puVar26;
          if (local_a0 == puVar26) break;
          bVar34 = puVar26 <= (ulong *)((long)local_a0 - (ulong)(local_124 >> 3));
          uVar15 = (int)local_a0 - iVar22;
          if (bVar34) {
            uVar15 = local_124 >> 3;
          }
          local_124 = local_124 + uVar15 * -8;
        }
        else {
          uVar15 = local_124 >> 3;
          local_124 = local_124 & 7;
          bVar34 = true;
        }
        puVar21 = (ulong *)((long)local_a0 - (ulong)uVar15);
        local_148 = *puVar21;
        if (((undefined2 *)((long)local_d0 - 9U) <= local_138) || (!bVar34)) break;
        uVar16 = (local_148 << ((byte)local_124 & 0x3f)) >> bVar18;
        *local_138 = (short)DTable[uVar16 + 1];
        iVar23 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_124;
        uVar29 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar16 = (local_148 << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)local_138 + uVar29) = (short)DTable[uVar16 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar23;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        lVar10 = uVar16 + uVar29;
        uVar25 = (local_148 << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)local_138 + uVar16 + uVar29) = (short)DTable[uVar25 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
        uVar29 = (local_148 << ((byte)iVar23 & 0x3f)) >> bVar18;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
        lVar11 = uVar16 + lVar10;
        *(short *)((long)local_138 + uVar16 + lVar10) = (short)DTable[uVar29 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7);
        uVar29 = (local_148 << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)local_138 + uVar16 + lVar11) = (short)DTable[uVar29 + 1];
        local_124 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
        local_138 = (undefined2 *)
                    ((long)local_138 +
                    (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7) + uVar16 + lVar11);
        local_a0 = puVar21;
        if (0x40 < local_124) break;
      } while( true );
    }
  }
  else if (local_124 < 0x41) {
    bVar18 = -bVar2 & 0x3f;
    do {
      if (local_a0 < puVar1) {
        puVar21 = puVar26;
        if (local_a0 == puVar26) break;
        bVar34 = puVar26 <= (ulong *)((long)local_a0 - (ulong)(local_124 >> 3));
        uVar15 = (int)local_a0 - iVar22;
        if (bVar34) {
          uVar15 = local_124 >> 3;
        }
        local_124 = local_124 + uVar15 * -8;
      }
      else {
        uVar15 = local_124 >> 3;
        local_124 = local_124 & 7;
        bVar34 = true;
      }
      puVar21 = (ulong *)((long)local_a0 - (ulong)uVar15);
      local_148 = *puVar21;
      if (((undefined2 *)((long)local_d0 - 7U) <= local_138) || (!bVar34)) break;
      uVar16 = (local_148 << ((byte)local_124 & 0x3f)) >> bVar18;
      *local_138 = (short)DTable[uVar16 + 1];
      iVar23 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_124;
      uVar29 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      uVar16 = (local_148 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)local_138 + uVar29) = (short)DTable[uVar16 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar23;
      uVar25 = (local_148 << ((byte)iVar23 & 0x3f)) >> bVar18;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
      lVar10 = uVar16 + uVar29;
      *(short *)((long)local_138 + uVar16 + uVar29) = (short)DTable[uVar25 + 1];
      iVar23 = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
      uVar16 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
      uVar29 = (local_148 << ((byte)iVar23 & 0x3f)) >> bVar18;
      *(short *)((long)local_138 + uVar16 + lVar10) = (short)DTable[uVar29 + 1];
      local_124 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
      local_138 = (undefined2 *)
                  ((long)local_138 +
                  (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7) + uVar16 + lVar10);
      local_a0 = puVar21;
      if (0x40 < local_124) break;
    } while( true );
  }
LAB_001910af:
  if (1 < (ulong)((long)local_d0 - (long)local_138)) {
    for (; puVar14 = puVar21, local_124 < 0x41;
        local_124 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_124) {
      if (puVar21 < puVar1) {
        puVar14 = puVar26;
        if (puVar21 == puVar26) break;
        bVar34 = puVar26 <= (ulong *)((long)puVar21 - (ulong)(local_124 >> 3));
        uVar15 = (int)puVar21 - iVar22;
        if (bVar34) {
          uVar15 = local_124 >> 3;
        }
        local_124 = local_124 + uVar15 * -8;
      }
      else {
        uVar15 = local_124 >> 3;
        local_124 = local_124 & 7;
        bVar34 = true;
      }
      puVar21 = (ulong *)((long)puVar21 - (ulong)uVar15);
      local_148 = *puVar21;
      puVar14 = puVar21;
      if ((local_d0 + -1 < local_138) || (!bVar34)) break;
      uVar16 = (local_148 << ((byte)local_124 & 0x3f)) >> (-bVar2 & 0x3f);
      *local_138 = (short)DTable[uVar16 + 1];
      local_138 = (undefined2 *)((long)local_138 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7));
    }
    for (; puVar21 = puVar14, local_138 <= local_d0 + -1;
        local_138 = (undefined2 *)
                    ((ulong)*(byte *)((long)DTable + uVar16 * 4 + 7) + (long)local_138)) {
      uVar16 = (local_148 << ((byte)local_124 & 0x3f)) >> (-bVar2 & 0x3f);
      *local_138 = (short)DTable[uVar16 + 1];
      local_124 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_124;
      puVar14 = puVar21;
    }
  }
  if (local_138 < local_d0) {
    uVar16 = (local_148 << ((byte)local_124 & 0x3f)) >> (-bVar2 & 0x3f);
    *(char *)local_138 = (char)DTable[uVar16 + 1];
    if (*(char *)((long)DTable + uVar16 * 4 + 7) == '\x01') {
      local_124 = local_124 + *(byte *)((long)DTable + uVar16 * 4 + 6);
    }
    else if ((local_124 < 0x40) &&
            (local_124 = local_124 + *(byte *)((long)DTable + uVar16 * 4 + 6), 0x3f < local_124)) {
      local_124 = 0x40;
    }
  }
  iVar22 = (int)local_110.start;
  if ((ulong)((long)local_98 - (long)local_120) < 8) {
    uVar16 = (ulong)local_110.bitsConsumed;
    if (uVar16 < 0x41) {
      if (local_110.ptr < local_110.limitPtr) {
        if (local_110.ptr == local_110.start) goto LAB_001915e5;
        uVar15 = (int)local_110.ptr - iVar22;
        if (local_110.start <=
            (size_t *)((long)local_110.ptr - (ulong)(local_110.bitsConsumed >> 3))) {
          uVar15 = local_110.bitsConsumed >> 3;
        }
        local_110.bitsConsumed = local_110.bitsConsumed + uVar15 * -8;
      }
      else {
        uVar15 = local_110.bitsConsumed >> 3;
        local_110.bitsConsumed = local_110.bitsConsumed & 7;
      }
      local_110.ptr = (char *)((long)local_110.ptr - (ulong)uVar15);
      uVar16 = (ulong)local_110.bitsConsumed;
      local_110.bitContainer = *(size_t *)local_110.ptr;
    }
  }
  else {
    uVar16 = (ulong)local_110.bitsConsumed;
    if (bVar2 < 0xc) {
      if (local_110.bitsConsumed < 0x41) {
        bVar18 = -bVar2 & 0x3f;
        do {
          if (local_110.ptr < local_110.limitPtr) {
            if (local_110.ptr == local_110.start) break;
            bVar34 = local_110.start <= (size_t *)((long)local_110.ptr - (uVar16 >> 3));
            uVar29 = (ulong)(uint)((int)local_110.ptr - iVar22);
            if (bVar34) {
              uVar29 = uVar16 >> 3;
            }
            local_110.bitsConsumed = (uint)uVar16 + (int)uVar29 * -8;
          }
          else {
            uVar29 = uVar16 >> 3;
            local_110.bitsConsumed = (uint)uVar16 & 7;
            bVar34 = true;
          }
          local_110.ptr = (char *)((long)local_110.ptr - uVar29);
          uVar16 = (ulong)local_110.bitsConsumed;
          local_110.bitContainer = *(size_t *)local_110.ptr;
          if (((undefined2 *)((long)local_98 - 9U) <= local_120) || (!bVar34)) break;
          uVar16 = (local_110.bitContainer << ((byte)local_110.bitsConsumed & 0x3f)) >> bVar18;
          *local_120 = (short)DTable[uVar16 + 1];
          iVar23 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_110.bitsConsumed;
          uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
          uVar29 = (local_110.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar18;
          *(short *)((long)local_120 + uVar16) = (short)DTable[uVar29 + 1];
          iVar23 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
          uVar29 = (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7);
          uVar25 = (local_110.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar18;
          lVar10 = uVar29 + uVar16;
          *(short *)((long)local_120 + uVar29 + uVar16) = (short)DTable[uVar25 + 1];
          iVar23 = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
          uVar16 = (local_110.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar18;
          uVar29 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
          lVar11 = uVar29 + lVar10;
          *(short *)((long)local_120 + uVar29 + lVar10) = (short)DTable[uVar16 + 1];
          iVar23 = (uint)*(byte *)((long)DTable + uVar16 * 4 + 6) + iVar23;
          uVar29 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
          uVar25 = (local_110.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar18;
          *(short *)((long)local_120 + uVar29 + lVar11) = (short)DTable[uVar25 + 1];
          local_110.bitsConsumed = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
          uVar16 = (ulong)local_110.bitsConsumed;
          local_120 = (undefined2 *)
                      ((long)local_120 +
                      (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7) + uVar29 + lVar11);
          if (0x40 < local_110.bitsConsumed) break;
        } while( true );
      }
    }
    else if (local_110.bitsConsumed < 0x41) {
      bVar18 = -bVar2 & 0x3f;
      do {
        if (local_110.ptr < local_110.limitPtr) {
          if (local_110.ptr == local_110.start) break;
          bVar34 = local_110.start <= (size_t *)((long)local_110.ptr - (uVar16 >> 3));
          uVar29 = (ulong)(uint)((int)local_110.ptr - iVar22);
          if (bVar34) {
            uVar29 = uVar16 >> 3;
          }
          local_110.bitsConsumed = (uint)uVar16 + (int)uVar29 * -8;
        }
        else {
          uVar29 = uVar16 >> 3;
          local_110.bitsConsumed = (uint)uVar16 & 7;
          bVar34 = true;
        }
        local_110.ptr = (char *)((long)local_110.ptr - uVar29);
        uVar16 = (ulong)local_110.bitsConsumed;
        local_110.bitContainer = *(size_t *)local_110.ptr;
        if ((puVar19 <= local_120) || (!bVar34)) break;
        uVar16 = (local_110.bitContainer << ((byte)local_110.bitsConsumed & 0x3f)) >> bVar18;
        *local_120 = (short)DTable[uVar16 + 1];
        iVar23 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_110.bitsConsumed;
        uVar16 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
        uVar25 = (local_110.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)local_120 + uVar16) = (short)DTable[uVar25 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
        uVar29 = (local_110.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar18;
        uVar25 = (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7);
        lVar10 = uVar25 + uVar16;
        *(short *)((long)local_120 + uVar25 + uVar16) = (short)DTable[uVar29 + 1];
        iVar23 = (uint)*(byte *)((long)DTable + uVar29 * 4 + 6) + iVar23;
        uVar29 = (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7);
        uVar25 = (local_110.bitContainer << ((byte)iVar23 & 0x3f)) >> bVar18;
        *(short *)((long)local_120 + uVar29 + lVar10) = (short)DTable[uVar25 + 1];
        local_110.bitsConsumed = (uint)*(byte *)((long)DTable + uVar25 * 4 + 6) + iVar23;
        uVar16 = (ulong)local_110.bitsConsumed;
        local_120 = (undefined2 *)
                    ((long)local_120 +
                    (ulong)*(byte *)((long)DTable + uVar25 * 4 + 7) + uVar29 + lVar10);
        if (0x40 < local_110.bitsConsumed) break;
      } while( true );
    }
  }
LAB_001915e5:
  uVar15 = (uint)uVar16;
  if (1 < (ulong)((long)local_98 - (long)local_120)) {
    while (uVar15 = (uint)uVar16, uVar15 < 0x41) {
      if (local_110.ptr < local_110.limitPtr) {
        if (local_110.ptr == local_110.start) break;
        bVar34 = local_110.start <= (size_t *)((long)local_110.ptr - (uVar16 >> 3));
        uVar29 = (ulong)(uint)((int)local_110.ptr - iVar22);
        if (bVar34) {
          uVar29 = uVar16 >> 3;
        }
        local_110.bitsConsumed = uVar15 + (int)uVar29 * -8;
      }
      else {
        uVar29 = uVar16 >> 3;
        local_110.bitsConsumed = uVar15 & 7;
        bVar34 = true;
      }
      local_110.ptr = (char *)((long)local_110.ptr - uVar29);
      uVar16 = (ulong)local_110.bitsConsumed;
      local_110.bitContainer = *(size_t *)local_110.ptr;
      if ((local_98 + -1 < local_120) || (!bVar34)) break;
      uVar16 = (local_110.bitContainer << ((byte)local_110.bitsConsumed & 0x3f)) >> (-bVar2 & 0x3f);
      *local_120 = (short)DTable[uVar16 + 1];
      local_110.bitsConsumed = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_110.bitsConsumed;
      local_120 = (undefined2 *)((long)local_120 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7));
      uVar16 = (ulong)local_110.bitsConsumed;
    }
    uVar15 = (uint)uVar16;
    for (; local_120 <= local_98 + -1;
        local_120 = (undefined2 *)
                    ((long)local_120 + (ulong)*(byte *)((long)DTable + uVar29 * 4 + 7))) {
      uVar29 = (local_110.bitContainer << ((byte)uVar16 & 0x3f)) >> (-bVar2 & 0x3f);
      *local_120 = (short)DTable[uVar29 + 1];
      uVar15 = *(byte *)((long)DTable + uVar29 * 4 + 6) + local_110.bitsConsumed;
      uVar16 = (ulong)uVar15;
      local_110.bitsConsumed = uVar15;
    }
  }
  if (local_120 < local_98) {
    uVar16 = (local_110.bitContainer << ((byte)uVar15 & 0x3f)) >> (-bVar2 & 0x3f);
    *(char *)local_120 = (char)DTable[uVar16 + 1];
    if (*(char *)((long)DTable + uVar16 * 4 + 7) == '\x01') {
      uVar15 = *(byte *)((long)DTable + uVar16 * 4 + 6) + local_110.bitsConsumed;
    }
    else {
      uVar15 = local_110.bitsConsumed;
      if (local_110.bitsConsumed < 0x40) {
        local_110.bitsConsumed = local_110.bitsConsumed + *(byte *)((long)DTable + uVar16 * 4 + 6);
        uVar15 = 0x40;
        if (local_110.bitsConsumed < 0x40) {
          uVar15 = local_110.bitsConsumed;
        }
      }
    }
  }
  if (uVar15 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_110.ptr != local_110.start) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_124 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (puVar21 != puVar26) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_154 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (puVar20 != puVar28) {
    dstSize = 0xffffffffffffffec;
  }
  if (local_150 != 0x40) {
    dstSize = 0xffffffffffffffec;
  }
  if (puVar33 != local_d8) {
    return 0xffffffffffffffec;
  }
  return dstSize;
}

Assistant:

static size_t HUF_decompress4X2_usingDTable_internal(void* dst, size_t dstSize, void const* cSrc,
                    size_t cSrcSize, HUF_DTable const* DTable, int flags)
{
    HUF_DecompressUsingDTableFn fallbackFn = HUF_decompress4X2_usingDTable_internal_default;
    HUF_DecompressFastLoopFn loopFn = HUF_decompress4X2_usingDTable_internal_fast_c_loop;

#if DYNAMIC_BMI2
    if (flags & HUF_flags_bmi2) {
        fallbackFn = HUF_decompress4X2_usingDTable_internal_bmi2;
# if ZSTD_ENABLE_ASM_X86_64_BMI2
        if (!(flags & HUF_flags_disableAsm)) {
            loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
        }
# endif
    } else {
        return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
    }
#endif

#if ZSTD_ENABLE_ASM_X86_64_BMI2 && defined(__BMI2__)
    if (!(flags & HUF_flags_disableAsm)) {
        loopFn = HUF_decompress4X2_usingDTable_internal_fast_asm_loop;
    }
#endif

    if (!(flags & HUF_flags_disableFast)) {
        size_t const ret = HUF_decompress4X2_usingDTable_internal_fast(dst, dstSize, cSrc, cSrcSize, DTable, loopFn);
        if (ret != 0)
            return ret;
    }
    return fallbackFn(dst, dstSize, cSrc, cSrcSize, DTable);
}